

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

char * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::AllocInternal<false>
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this,size_t *pageCount,SegmentBase<Memory::PreReservedVirtualAllocWrapper> **segment)

{
  code *pcVar1;
  bool bVar2;
  SegmentBase<Memory::PreReservedVirtualAllocWrapper> *pSVar3;
  undefined4 *puVar4;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *local_38;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *pageSegment;
  SegmentBase<Memory::PreReservedVirtualAllocWrapper> *newSegment;
  char *addr;
  SegmentBase<Memory::PreReservedVirtualAllocWrapper> **segment_local;
  size_t *pageCount_local;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *this_local;
  
  newSegment = (SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0;
  addr = (char *)segment;
  segment_local = (SegmentBase<Memory::PreReservedVirtualAllocWrapper> **)pageCount;
  pageCount_local = (size_t *)this;
  if ((ulong)this->maxAllocPageCount < *pageCount) {
    pageSegment = (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)
                  AllocSegment(this,*pageCount);
    if (pageSegment != (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0) {
      newSegment = (SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)
                   SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAddress
                             ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)pageSegment);
      pSVar3 = (SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)
               SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAvailablePageCount
                         (&pageSegment->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
      *segment_local = pSVar3;
      *(PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> **)addr = pageSegment;
    }
  }
  else {
    if (0xffffffff < *pageCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x507,"(*pageCount <= (2147483647 *2U +1U))","*pageCount <= UINT_MAX");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    newSegment = (SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)
                 AllocPages(this,(uint)*segment_local,&local_38);
    if (newSegment != (SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0) {
      *(PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> **)addr = local_38;
    }
  }
  return (char *)newSegment;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::AllocInternal(size_t * pageCount, TSegment ** segment)
{
    char * addr = nullptr;

    if (*pageCount > this->maxAllocPageCount)
    {
        // Don't bother trying to do single chunk allocation here
        // We're allocating a new segment. If the segment size is
        // within a single chunk, great, otherwise, doesn't matter

        // We need some space reserved for secondary allocations
        TSegment * newSegment = this->AllocSegment(*pageCount);
        if (newSegment != nullptr)
        {
            addr = newSegment->GetAddress();
            *pageCount = newSegment->GetAvailablePageCount();
            *segment = newSegment;
        }
    }
    else
    {
        Assert(*pageCount <= UINT_MAX);
        TPageSegment * pageSegment;

        if (doPageAlign)
        {
            // TODO: Remove this entire codepath since doPageAlign is not being used anymore
            addr = this->AllocPagesPageAligned((uint)*pageCount, &pageSegment);
        }
        else
        {
            addr = this->AllocPages((uint) *pageCount, &pageSegment);
        }

        if (addr != nullptr)
        {
            *segment = pageSegment;
        }
    }
    return addr;
}